

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_expression.cpp
# Opt level: O0

bool __thiscall duckdb::ParsedExpression::IsScalar(ParsedExpression *this)

{
  bool is_scalar;
  anon_class_8_1_fb1f5341 *in_stack_ffffffffffffffb8;
  function<void_(const_duckdb::ParsedExpression_&)> *in_stack_ffffffffffffffc0;
  function<void_(const_duckdb::ParsedExpression_&)> *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar1;
  
  bVar1 = 1;
  ::std::function<void(duckdb::ParsedExpression_const&)>::
  function<duckdb::ParsedExpression::IsScalar()const::__0,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ParsedExpressionIterator::EnumerateChildren
            ((ParsedExpression *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
            );
  ::std::function<void_(const_duckdb::ParsedExpression_&)>::~function
            ((function<void_(const_duckdb::ParsedExpression_&)> *)0x23020f);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ParsedExpression::IsScalar() const {
	bool is_scalar = true;
	ParsedExpressionIterator::EnumerateChildren(*this, [&](const ParsedExpression &child) {
		if (!child.IsScalar()) {
			is_scalar = false;
		}
	});
	return is_scalar;
}